

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_settable(lua_State *L,int idx)

{
  int iVar1;
  int *piVar2;
  TValue *t;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3e9,"void lua_settable(lua_State *, int)");
  }
  if (0x20 < (long)L->top - (long)L->ci->func) {
    t = index2addr(L,idx);
    luaV_settable(L,t,L->top + -2,L->top + -1);
    L->top = L->top + -2;
    piVar2 = *(int **)&L[-1].hookmask;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      return;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3ee,"void lua_settable(lua_State *, int)");
  }
  __assert_fail("((2) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x3ea,"void lua_settable(lua_State *, int)");
}

Assistant:

LUA_API void lua_settable (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2addr(L, idx);
  luaV_settable(L, t, L->top - 2, L->top - 1);
  L->top -= 2;  /* pop index and value */
  lua_unlock(L);
}